

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

void * uhash_put_63(UHashtable *hash,void *key,void *value,UErrorCode *status)

{
  UHashTok UVar1;
  
  UVar1 = _uhash_put(hash,key,value,'\x03',status);
  return UVar1.pointer;
}

Assistant:

U_CAPI void* U_EXPORT2
uhash_put(UHashtable *hash,
          void* key,
          void* value,
          UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.pointer = key;
    valueholder.pointer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      HINT_KEY_POINTER | HINT_VALUE_POINTER,
                      status).pointer;
}